

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_0::CWriter::WriteSignedBinaryExpr(CWriter *this,Opcode opcode,char *op)

{
  Enum EVar1;
  Enum EVar2;
  Newline local_bd;
  Type local_bc;
  StackVar local_b4;
  Type local_a8;
  SignedType local_a0;
  Type local_98;
  StackVar local_90;
  Type local_84;
  SignedType local_7c;
  Type local_74;
  StackVar local_6c;
  Type local_60;
  Type local_58;
  Type type;
  Type result_type;
  char *op_local;
  CWriter *this_local;
  Opcode opcode_local;
  
  result_type = (Type)op;
  this_local._4_4_ = opcode.enum_;
  type = Opcode::GetResultType((Opcode *)((long)&this_local + 4));
  local_58 = Opcode::GetParamType1((Opcode *)((long)&this_local + 4));
  local_60 = Opcode::GetParamType2((Opcode *)((long)&this_local + 4));
  EVar1 = Type::operator_cast_to_Enum(&local_60);
  EVar2 = Type::operator_cast_to_Enum(&local_58);
  if (EVar1 == EVar2) {
    local_74 = type;
    StackVar::StackVar(&local_6c,1,type);
    local_84 = local_58;
    SignedType::SignedType(&local_7c,local_58);
    Type::Type(&local_98,Any);
    StackVar::StackVar(&local_90,1,local_98);
    local_a8 = local_58;
    SignedType::SignedType(&local_a0,local_58);
    Type::Type(&local_bc,Any);
    StackVar::StackVar(&local_b4,0,local_bc);
    (anonymous_namespace)::CWriter::
    Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[5],wabt::Type&,char_const(&)[4],wabt::(anonymous_namespace)::SignedType,char_const(&)[2],wabt::(anonymous_namespace)::StackVar,char_const(&)[2],char_const*&,char_const(&)[3],wabt::(anonymous_namespace)::SignedType,char_const(&)[2],wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,&local_6c,(char (*) [5])" = (",&local_58,(char (*) [4])")((",
               &local_7c,(char (*) [2])0x21dbf2,&local_90,(char (*) [2])0x21a9d7,
               (char **)&result_type,(char (*) [3])0x21ea67,&local_a0,(char (*) [2])0x21dbf2,
               &local_b4,(char (*) [3])0x221bfb,&local_bd);
    DropTypes(this,2);
    PushType(this,type);
    return;
  }
  __assert_fail("opcode.GetParamType2() == type",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                ,0xcbf,
                "void wabt::(anonymous namespace)::CWriter::WriteSignedBinaryExpr(Opcode, const char *)"
               );
}

Assistant:

void CWriter::WriteSignedBinaryExpr(Opcode opcode, const char* op) {
  Type result_type = opcode.GetResultType();
  Type type = opcode.GetParamType1();
  assert(opcode.GetParamType2() == type);
  Write(StackVar(1, result_type), " = (", type, ")((", SignedType(type), ")",
        StackVar(1), " ", op, " (", SignedType(type), ")", StackVar(0), ");",
        Newline());
  DropTypes(2);
  PushType(result_type);
}